

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O0

void __thiscall HDualRow::rp_hsol_pv_r(HDualRow *this)

{
  reference pvVar1;
  reference pvVar2;
  undefined8 *in_RDI;
  int i_2;
  int i_1;
  int c_n;
  int i;
  vector<double,_std::allocator<double>_> dse_pv_r;
  int numTot;
  int mx_rp_numTot;
  size_type in_stack_ffffffffffffff98;
  value_type vVar3;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  uint local_48;
  int local_40;
  vector<double,_std::allocator<double>_> local_28;
  int local_10;
  undefined4 local_c;
  
  local_c = 0x14;
  local_10 = HModel::getNumTot((HModel *)*in_RDI);
  if (local_10 < 0x15) {
    this_00 = &local_28;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x156432);
    std::vector<double,_std::allocator<double>_>::assign
              (this_00,in_stack_ffffffffffffff98,(value_type_conflict1 *)0x15644f);
    for (local_40 = 0; local_40 < *(int *)(in_RDI + 0xc); local_40 = local_40 + 1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd),(long)local_40);
      iVar4 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_40)
      ;
      vVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,(long)iVar4);
      *pvVar2 = vVar3;
    }
    printf("PvR: Ix  ");
    for (local_48 = 0; (int)local_48 < local_10; local_48 = local_48 + 1) {
      printf(" %4d",(ulong)local_48);
    }
    printf("\n");
    printf("      V  ");
    for (iVar4 = 0; iVar4 < local_10; iVar4 = iVar4 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,(long)iVar4);
      printf(" %4.1g",*pvVar2);
    }
    printf("\n");
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar4,in_stack_ffffffffffffffb0))
    ;
  }
  return;
}

Assistant:

void HDualRow::rp_hsol_pv_r() {
 	//Set limits on problem size for reporting
	const int mx_rp_numTot = 20;
	int numTot = workModel->getNumTot();
	if (numTot>mx_rp_numTot) return;
	vector<double> dse_pv_r;
	dse_pv_r.assign(numTot, 0);
	for (int i = 0; i < packCount; i++) {
		int c_n = packIndex[i];
		dse_pv_r[c_n] = packValue[i];
	}
	printf("PvR: Ix  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", i);
	}
	printf("\n");
	printf("      V  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4.1g", dse_pv_r[i]);
	}
	printf("\n");

}